

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool __thiscall
source::document_iter(source *this,CharContent *uri,Response *response,CharContent *file_path)

{
  int iVar1;
  char *__name;
  DIR *__dirp;
  undefined1 local_1e8 [8];
  CharContent res_cont;
  undefined1 local_1b8 [7];
  bool get_in;
  dirent pStEntry;
  dirent *pStResult;
  DIR *dir_ptr;
  CharContent true_uri;
  CharContent local_58;
  size_t local_30;
  size_t pos;
  CharContent *file_path_local;
  Response *response_local;
  CharContent *uri_local;
  source *this_local;
  
  local_30 = 0;
  pos = (size_t)file_path;
  file_path_local = &response->code;
  response_local = (Response *)uri;
  uri_local = (CharContent *)this;
  CharContent::CharContent(&local_58,"?");
  local_30 = CharContent::find(uri,&local_58,0);
  CharContent::~CharContent(&local_58);
  CharContent::subCharContent((CharContent *)&dir_ptr,uri,0,local_30);
  __name = CharContent::c_str(file_path);
  __dirp = opendir(__name);
  pStEntry.d_name[0xfd] = '\0';
  pStEntry.d_name[0xfe] = '\0';
  pStEntry.d_name[0xff] = '\0';
  pStEntry._275_5_ = 0;
  res_cont.m_length._7_1_ = 0;
  CharContent::CharContent((CharContent *)local_1e8);
  CharContent::append((CharContent *)local_1e8,"<html><head>file index</head><body>");
  while (iVar1 = readdir_r(__dirp,(dirent *)local_1b8,(dirent **)(pStEntry.d_name + 0xfd)),
        -1 < iVar1 && pStEntry._272_8_ != 0) {
    if (pStEntry.d_off._3_1_ != '.') {
      res_cont.m_length._7_1_ = 1;
      CharContent::append((CharContent *)local_1e8,"<p><a href=\'");
      CharContent::append((CharContent *)local_1e8,(CharContent *)&dir_ptr);
      CharContent::append((CharContent *)local_1e8,"/");
      CharContent::append((CharContent *)local_1e8,(char *)((long)&pStEntry.d_off + 3));
      CharContent::append((CharContent *)local_1e8,"\'>");
      CharContent::append((CharContent *)local_1e8,(char *)((long)&pStEntry.d_off + 3));
      CharContent::append((CharContent *)local_1e8,"</a></p>");
    }
  }
  if ((res_cont.m_length._7_1_ & 1) == 0) {
    CharContent::append((CharContent *)local_1e8,"<h1>no content</h1>");
  }
  CharContent::append((CharContent *)local_1e8,"</body></html>");
  CharContent::operator=(file_path_local + 2,(CharContent *)local_1e8);
  closedir(__dirp);
  CharContent::~CharContent((CharContent *)local_1e8);
  CharContent::~CharContent((CharContent *)&dir_ptr);
  return true;
}

Assistant:

bool source::document_iter(CharContent uri,Response *response,CharContent file_path){
	size_t pos=0;
	pos=uri.find("?");
	CharContent true_uri=uri.subCharContent(0,pos);
	DIR *dir_ptr=opendir(file_path.c_str());
	struct dirent *pStResult = NULL;
	struct dirent pStEntry;
	bool get_in=false;
	CharContent res_cont;
	res_cont.append("<html><head>file index</head><body>");
	while(readdir_r(dir_ptr,&pStEntry,&pStResult)>=0&&pStResult!=NULL){
		if(pStEntry.d_name[0]=='.')
			continue;
		get_in=true;
		res_cont.append("<p><a href=\'");
		res_cont.append(true_uri);
		res_cont.append("/");
		res_cont.append(pStEntry.d_name);
		res_cont.append("\'>");
		res_cont.append(pStEntry.d_name);
		res_cont.append("</a></p>");
	}
	if(!get_in)
		res_cont.append("<h1>no content</h1>");
	res_cont.append("</body></html>");
	response->Entity=res_cont;
	closedir(dir_ptr);
	return true;
}